

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_info.cpp
# Opt level: O1

ktx_error_code_e __thiscall
ktx::CommandInfo::printInfoJSON(CommandInfo *this,istream *file,bool minified)

{
  pointer __s1;
  size_type sVar1;
  int iVar2;
  ktx_error_code_e kVar3;
  long lVar4;
  int iVar5;
  undefined7 in_register_00000011;
  char *pcVar6;
  size_type __rlen;
  int iVar7;
  ktx_error_code_e kVar8;
  size_type sVar9;
  format_args args;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_string_view<char> format_str_02;
  basic_string_view<char> format_str_03;
  basic_string_view<char> format_str_04;
  basic_string_view<char> format_str_05;
  basic_string_view<char> format_str_06;
  basic_string_view<char> format_str_07;
  basic_string_view<char> format_str_08;
  basic_string_view<char> format_str_09;
  basic_string_view<char> format_str_10;
  basic_string_view<char> format_str_11;
  basic_string_view<char> format_str_12;
  basic_string_view<char> format_str_13;
  basic_string_view<char> format_str_14;
  basic_string_view<char> format_str_15;
  basic_string_view<char> format_str_16;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_00;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_01;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_02;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_03;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_04;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_05;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_06;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_07;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_08;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_09;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_10;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_11;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_12;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_13;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_14;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_15;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_16;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_17;
  string_view fmt;
  bool first;
  char *nl;
  StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> ktx2Stream;
  char *space;
  PrintIndent pi;
  ostringstream messagesOS;
  char local_249;
  undefined **local_248;
  int local_23c;
  undefined1 local_238 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  undefined **local_218;
  undefined **local_208;
  int local_1fc;
  ostringstream *local_1f8;
  undefined4 local_1f0;
  int local_1ec;
  _Any_data local_1e8;
  code *local_1d8;
  code *pcStack_1d0;
  undefined **local_1c8;
  basic_streambuf<char,_std::char_traits<char>_> *pbStack_1c0;
  undefined8 local_1b8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  iVar5 = (int)CONCAT71(in_register_00000011,minified);
  sVar9 = (ulong)!minified << 2;
  local_208 = (undefined **)0x200d21;
  if (iVar5 != 0) {
    local_208 = (undefined **)0x219e6c;
  }
  local_248 = (undefined **)0x1fee52;
  if (iVar5 != 0) {
    local_248 = (undefined **)0x219e6c;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  local_1f0 = 0;
  iVar7 = (int)sVar9;
  local_249 = '\x01';
  __s1 = (this->options).super_OptionsSingleIn.inputFilepath._M_dataplus._M_p;
  sVar1 = (this->options).super_OptionsSingleIn.inputFilepath._M_string_length;
  local_1f8 = local_1a8;
  local_1ec = iVar7;
  if ((sVar1 == 1) && (iVar2 = bcmp(__s1,"-",1), iVar2 == 0)) {
    local_238._0_8_ = local_238 + 0x10;
    local_228._M_allocated_capacity._0_6_ = 0x6e69647473;
    local_238._8_8_ = (basic_streambuf<char,_std::char_traits<char>_> *)0x5;
  }
  else {
    local_238._0_8_ = local_238 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_238,__s1,__s1 + sVar1);
  }
  local_1d8 = (code *)0x0;
  pcStack_1d0 = (code *)0x0;
  local_1e8._M_unused._M_object = (void *)0x0;
  local_1e8._8_8_ = 0;
  local_1e8._M_unused._M_object = operator_new(0x20);
  *(char **)local_1e8._M_unused._0_8_ = &local_249;
  *(ostringstream ***)((long)local_1e8._M_unused._0_8_ + 8) = &local_1f8;
  *(undefined ****)((long)local_1e8._M_unused._0_8_ + 0x10) = &local_248;
  *(undefined ****)((long)local_1e8._M_unused._0_8_ + 0x18) = &local_208;
  pcStack_1d0 = std::
                _Function_handler<void_(const_ktx::ValidationReport_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_info.cpp:170:106)>
                ::_M_invoke;
  local_1d8 = std::
              _Function_handler<void_(const_ktx::ValidationReport_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_info.cpp:170:106)>
              ::_M_manager;
  local_23c = validateIOStream(file,(string *)local_238,false,false,
                               (function<void_(const_ktx::ValidationReport_&)> *)&local_1e8);
  if (local_1d8 != (code *)0x0) {
    (*local_1d8)(&local_1e8,&local_1e8,__destroy_functor);
  }
  if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
    operator_delete((void *)local_238._0_8_,local_228._M_allocated_capacity + 1);
  }
  std::ios::clear((int)*(undefined8 *)(*(long *)file + -0x18) + (int)file);
  std::istream::seekg((long)file,_S_beg);
  local_1fc = iVar5;
  lVar4 = std::istream::tellg();
  pcVar6 = "";
  if (0xb < lVar4) {
    std::istream::seekg((long)file,_S_beg);
    std::istream::read((char *)file,(long)local_238);
    pcVar6 = "";
    if ((local_238._8_4_ == 0xa1a0a0d && (pointer)local_238._0_8_ == (pointer)0xbb30322058544bab) &&
       (pcVar6 = "", 0x4f < lVar4)) {
      pcVar6 = ",";
    }
  }
  local_238._0_8_ = "";
  local_228._M_allocated_capacity = 0;
  format_str.size_ = 5;
  format_str.data_ = "{:{}}";
  args_00.field_1.values_ =
       (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_238;
  args_00.desc_ = 0x1c;
  ::fmt::v10::vprint<char>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,format_str,args_00);
  local_238._0_8_ = local_248;
  format_str_00.size_ = 4;
  format_str_00.data_ = "{{{}";
  args_01.field_1.values_ =
       (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_238;
  args_01.desc_ = 0xc;
  ::fmt::v10::vprint<char>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,format_str_00,args_01);
  local_238._0_8_ = "";
  format_str_01.size_ = 5;
  format_str_01.data_ = "{:{}}";
  args_02.field_1.values_ =
       (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_238;
  args_02.desc_ = 0x1c;
  local_228._M_allocated_capacity = sVar9;
  ::fmt::v10::vprint<char>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,format_str_01,args_02);
  local_238._0_8_ = local_208;
  local_228._M_allocated_capacity = (size_type)local_248;
  format_str_02.size_ = 0x3c;
  format_str_02.data_ = "\"$schema\":{}\"https://schema.khronos.org/ktx/info_v0.json\",{}";
  args_03.field_1.values_ =
       (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_238;
  args_03.desc_ = 0xcc;
  ::fmt::v10::vprint<char>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,format_str_02,args_03);
  local_238._0_8_ = "";
  format_str_03.size_ = 5;
  format_str_03.data_ = "{:{}}";
  args_04.field_1.values_ =
       (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_238;
  args_04.desc_ = 0x1c;
  local_228._M_allocated_capacity = sVar9;
  ::fmt::v10::vprint<char>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,format_str_03,args_04);
  local_228._M_allocated_capacity = (size_type)(local_23c == 0);
  local_238._0_8_ = local_208;
  local_218 = local_248;
  format_str_04.size_ = 0xf;
  format_str_04.data_ = "\"valid\":{}{},{}";
  args_05.field_1.values_ =
       (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_238;
  args_05.desc_ = 0xc7c;
  ::fmt::v10::vprint<char>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,format_str_04,args_05);
  if (local_249 == '\0') {
    local_238._0_8_ = "";
    format_str_07.size_ = 5;
    format_str_07.data_ = "{:{}}";
    args_08.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_238;
    args_08.desc_ = 0x1c;
    local_228._M_allocated_capacity = sVar9;
    ::fmt::v10::vprint<char>
              ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,format_str_07,args_08);
    local_238._0_8_ = local_208;
    local_228._M_allocated_capacity = (size_type)local_248;
    format_str_08.size_ = 0x10;
    format_str_08.data_ = "\"messages\":{}[{}";
    args_09.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_238;
    args_09.desc_ = 0xcc;
    ::fmt::v10::vprint<char>
              ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,format_str_08,args_09);
    std::__cxx11::stringbuf::str();
    local_1c8 = (undefined **)local_238._0_8_;
    pbStack_1c0 = (basic_streambuf<char,_std::char_traits<char>_> *)local_238._8_8_;
    args.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1c8;
    args.desc_ = 0xd;
    fmt.size_ = 2;
    fmt.data_ = "{}";
    ::fmt::v10::vprint(fmt,args);
    if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
      operator_delete((void *)local_238._0_8_,(ulong)(local_228._M_allocated_capacity + 1));
    }
    local_228._M_allocated_capacity = (size_type)(uint)(iVar7 * 2);
    local_238._0_8_ = "";
    format_str_09.size_ = 5;
    format_str_09.data_ = "{:{}}";
    args_10.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_238;
    args_10.desc_ = 0x1c;
    ::fmt::v10::vprint<char>
              ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,format_str_09,args_10);
    local_238._0_8_ = local_248;
    format_str_10.size_ = 4;
    format_str_10.data_ = "}}{}";
    args_11.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_238;
    args_11.desc_ = 0xc;
    ::fmt::v10::vprint<char>
              ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,format_str_10,args_11);
    local_238._0_8_ = "";
    format_str_11.size_ = 5;
    format_str_11.data_ = "{:{}}";
    args_12.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_238;
    args_12.desc_ = 0x1c;
    local_228._M_allocated_capacity = sVar9;
    ::fmt::v10::vprint<char>
              ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,format_str_11,args_12);
    local_228._M_allocated_capacity = (size_type)local_248;
    format_str_12.size_ = 5;
    format_str_12.data_ = "]{}{}";
    args_13.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_238;
    args_13.desc_ = 0xcc;
    local_238._0_8_ = pcVar6;
    ::fmt::v10::vprint<char>
              ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,format_str_12,args_13);
  }
  else {
    local_238._0_8_ = "";
    format_str_05.size_ = 5;
    format_str_05.data_ = "{:{}}";
    args_06.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_238;
    args_06.desc_ = 0x1c;
    local_228._M_allocated_capacity = sVar9;
    ::fmt::v10::vprint<char>
              ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,format_str_05,args_06);
    local_238._0_8_ = local_208;
    local_218 = local_248;
    format_str_06.size_ = 0x13;
    format_str_06.data_ = "\"messages\":{}[]{}{}";
    args_07.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_238;
    args_07.desc_ = 0xccc;
    local_228._M_allocated_capacity = (size_type)pcVar6;
    ::fmt::v10::vprint<char>
              ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,format_str_06,args_07);
  }
  std::istream::seekg((long)file,_S_beg);
  if (((byte)file[*(long *)(*(long *)file + -0x18) + 0x20] & 5) == 0) {
    local_238._8_8_ = *(undefined8 *)(file + *(long *)(*(long *)file + -0x18) + 0xe8);
    local_238._0_8_ = &PTR__StreambufStream_0025f618;
    local_228._M_allocated_capacity._0_4_ = 0xc;
    local_228._8_8_ = operator_new(0x68);
    *(undefined8 *)(local_228._8_8_ + 0x50) = 0;
    *(undefined8 *)(local_228._8_8_ + 0x58) = 0;
    *(undefined8 *)(local_228._8_8_ + 0x40) = 0;
    *(undefined8 *)(local_228._8_8_ + 0x48) = 0;
    *(undefined8 *)(local_228._8_8_ + 0x30) = 0;
    *(undefined8 *)(local_228._8_8_ + 0x38) = 0;
    *(undefined8 *)(local_228._8_8_ + 0x20) = 0;
    *(undefined8 *)(local_228._8_8_ + 0x28) = 0;
    *(undefined8 *)(local_228._8_8_ + 0x10) = 0;
    *(undefined8 *)(local_228._8_8_ + 0x18) = 0;
    *(undefined8 *)local_228._8_8_ = 0;
    *(undefined8 *)(local_228._8_8_ + 8) = 0;
    *(undefined8 *)(local_228._8_8_ + 0x60) = 0;
    local_218 = (undefined **)((ulong)local_218 & 0xffffffffffffff00);
    *(undefined4 *)(local_228._8_8_ + 0x38) = 3;
    *(undefined1 *)(local_228._8_8_ + 0x60) = 0;
    ((anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
      *)(local_228._8_8_ + 0x40))->values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_238;
    *(undefined8 *)(local_228._8_8_ + 0x48) = 0;
    *(undefined8 *)(local_228._8_8_ + 0x50) = 0;
    *(code **)local_228._8_8_ =
         StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::read;
    *(code **)(local_228._8_8_ + 8) =
         StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::skip;
    *(code **)(local_228._8_8_ + 0x10) =
         StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::write;
    *(code **)(local_228._8_8_ + 0x18) =
         StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::getpos;
    *(code **)(local_228._8_8_ + 0x20) =
         StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::setpos;
    *(code **)(local_228._8_8_ + 0x28) =
         StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::getsize;
    *(code **)(local_228._8_8_ + 0x30) =
         StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::destruct;
    kVar3 = ktxPrintKTX2InfoJSONForStream(local_228._8_8_,1,sVar9,(undefined1)local_1fc);
    local_1c8 = (undefined **)0x219e6c;
    local_1b8 = 0;
    format_str_15.size_ = 5;
    format_str_15.data_ = "{:{}}";
    args_16.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1c8;
    args_16.desc_ = 0x1c;
    ::fmt::v10::vprint<char>
              ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,format_str_15,args_16);
    local_1c8 = local_248;
    format_str_16.size_ = 4;
    format_str_16.data_ = "}}{}";
    args_17.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1c8;
    args_17.desc_ = 0xc;
    ::fmt::v10::vprint<char>
              ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,format_str_16,args_17);
    kVar8 = KTX_SUCCESS;
    if (local_23c == 0) {
      kVar8 = kVar3;
    }
    StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::~StreambufStream
              ((StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> *)local_238);
  }
  else {
    local_238._0_8_ = "";
    local_228._M_allocated_capacity = 0;
    format_str_13.size_ = 5;
    format_str_13.data_ = "{:{}}";
    args_14.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_238;
    args_14.desc_ = 0x1c;
    ::fmt::v10::vprint<char>
              ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,format_str_13,args_14);
    local_238._0_8_ = local_248;
    format_str_14.size_ = 4;
    format_str_14.data_ = "}}{}";
    args_15.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_238;
    args_15.desc_ = 0xc;
    ::fmt::v10::vprint<char>
              ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,format_str_14,args_15);
    kVar8 = KTX_FILE_SEEK_ERROR;
    if (local_23c != 0) {
      kVar8 = KTX_SUCCESS;
    }
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return kVar8;
}

Assistant:

KTX_error_code CommandInfo::printInfoJSON(std::istream& file, bool minified) {
    const auto base_indent = minified ? 0 : +0;
    const auto indent_width = minified ? 0 : 4;
    const auto space = minified ? "" : " ";
    const auto nl = minified ? "" : "\n";

    std::ostringstream messagesOS;
    PrintIndent pi{messagesOS, base_indent, indent_width};

    bool first = true;
    const auto validationResult = validateIOStream(file, fmtInFile(options.inputFilepath), false, false, [&](const ValidationReport& issue) {
        if (!std::exchange(first, false)) {
            pi(2, "}},{}", nl);
        }
        pi(2, "{{{}", nl);
        pi(3, "\"id\":{}{},{}", space, issue.id, nl);
        pi(3, "\"type\":{}\"{}\",{}", space, toString(issue.type), nl);
        pi(3, "\"message\":{}\"{}\",{}", space, escape_json_copy(issue.message), nl);
        pi(3, "\"details\":{}\"{}\"{}", space, escape_json_copy(issue.details), nl);
    });

    file.clear(); // Clear any unexpected EOF from validation

    // Workaround detection to decide if ktx will produce any output into the json
    // to eliminate a trailing comma
    file.seekg(0, std::ios_base::end);
    const auto fileSize = file.tellg();
    bool fileIdentifierIsCorrect = false;
    if (fileSize >= 12) {
        static constexpr uint8_t ktx2_identifier_reference[12] = KTX2_IDENTIFIER_REF;
        ktx_uint8_t identifier[12];
        file.seekg(0, std::ios_base::beg);
        file.read(reinterpret_cast<char*>(identifier), 12);
        fileIdentifierIsCorrect = std::memcmp(identifier, ktx2_identifier_reference, 12) == 0;
    }
    const auto ktxWillPrintOutput = fileIdentifierIsCorrect && fileSize >= KTX2_HEADER_SIZE;

    PrintIndent out{std::cout, base_indent, indent_width};
    out(0, "{{{}", nl);
    out(1, "\"$schema\":{}\"https://schema.khronos.org/ktx/info_v0.json\",{}", space, nl);
    out(1, "\"valid\":{}{},{}", space, validationResult == 0, nl);
    if (!first) {
        out(1, "\"messages\":{}[{}", space, nl);
        fmt::print("{}", std::move(messagesOS).str());
        out(2, "}}{}", nl);
        out(1, "]{}{}", ktxWillPrintOutput ? "," : "", nl);
    } else {
        out(1, "\"messages\":{}[]{}{}", space, ktxWillPrintOutput ? "," : "", nl);
    }

    file.seekg(0, std::ios_base::beg);
    if (!file) {
        out(0, "}}{}", nl);
        return validationResult == 0 ? KTX_FILE_SEEK_ERROR : KTX_SUCCESS;
    }

    StreambufStream<std::streambuf*> ktx2Stream{file.rdbuf(), std::ios::in | std::ios::binary};
    const auto result = ktxPrintKTX2InfoJSONForStream(ktx2Stream.stream(), base_indent + 1, indent_width, minified);
    out(0, "}}{}", nl);

    return validationResult == 0 ? result : KTX_SUCCESS;
}